

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O2

void __thiscall solitaire::Solitaire::tryPullOutCardFromFoundationPile(Solitaire *this,PileId *id)

{
  uint uVar1;
  bool bVar2;
  undefined4 extraout_var;
  pointer *__ptr;
  Snapshot *local_38;
  _Head_base<0UL,_solitaire::archivers::interfaces::Snapshot_*,_false> local_30;
  PileId local_24;
  _Storage<solitaire::cards::Card,_true> local_20 [2];
  
  local_24 = (PileId)id->t;
  throwExceptionOnInvalidFoundationPileId(this,&local_24);
  bVar2 = isGameInProgressAndHandIsEmpty(this);
  if (bVar2) {
    uVar1 = id->t;
    (*(((this->foundationPiles)._M_elems[uVar1].
        super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_Archiver)._vptr_Archiver[2])(&local_38);
    local_20[0]._0_4_ =
         (*(((this->foundationPiles)._M_elems[uVar1].
             super___shared_ptr<solitaire::piles::interfaces::FoundationPile,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_Archiver)._vptr_Archiver[5])();
    local_20[0]._M_value.suit = extraout_var;
    local_30._M_head_impl = local_38;
    local_38 = (Snapshot *)0x0;
    tryAddPulledOutCardToHand
              (this,(optional<solitaire::cards::Card> *)&local_20[0]._M_value,
               (SnapshotPtr *)&local_30);
    if (local_30._M_head_impl != (Snapshot *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Snapshot[1])();
    }
    if (local_38 != (Snapshot *)0x0) {
      (*local_38->_vptr_Snapshot[1])();
    }
  }
  return;
}

Assistant:

void Solitaire::tryPullOutCardFromFoundationPile(const PileId id) {
    throwExceptionOnInvalidFoundationPileId(id);
    if (isGameInProgressAndHandIsEmpty()) {
        auto& pile = foundationPiles[id];
        auto snapshot = pile->createSnapshot();
        tryAddPulledOutCardToHand(pile->tryPullOutCard(), std::move(snapshot));
    }
}